

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::remaxCol(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,int p_col,int len)

{
  int *piVar1;
  Dring *pDVar2;
  type_conflict5 tVar3;
  int iVar4;
  int in_EDX;
  int in_ESI;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  Dring *ring;
  int *idx;
  int k;
  int j;
  int i;
  int delta;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_2;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_3;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_3;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  cpp_dec_float<200U,_int,_void> *in_stack_fffffffffffffc98;
  int iVar5;
  cpp_dec_float<200U,_int,_void> *u;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffca0;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_350;
  undefined1 local_2d0 [148];
  int local_23c;
  int local_238;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_234;
  undefined1 local_1b4 [128];
  int local_134;
  int local_130;
  int local_12c;
  long local_120;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_111;
  int *local_110;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_108;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_100;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f8;
  int *local_f0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e0;
  long local_d8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_c9;
  int *local_c8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b0;
  int *local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_98;
  long local_90;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_81;
  int *local_80;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  int *local_60;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_58;
  undefined1 *local_50;
  long local_48;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_39;
  int *local_38;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  int *local_18;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_10;
  undefined1 *local_8;
  
  local_130 = in_EDX;
  local_12c = in_ESI;
  if ((Col *)(in_RDI->u).col.elem[in_ESI].next == &(in_RDI->u).col) {
    local_134 = in_EDX - (in_RDI->u).col.max[in_ESI];
    if ((in_RDI->u).col.size - (in_RDI->u).col.used < local_134) {
      packColumns(in_RDI);
      local_134 = local_130 - (in_RDI->u).col.max[local_12c];
      this_00 = (CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)&(in_RDI->u).col.size;
      local_c0 = &in_RDI->colMemMult;
      local_c8 = &(in_RDI->u).col.used;
      local_b8 = &local_234;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_c9,local_c0);
      local_b0 = &local_234;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<200U,_int,_void> *)this_00);
      local_98 = &local_234;
      local_a0 = local_c0;
      local_a8 = local_c8;
      local_d8 = (long)*local_c8;
      boost::multiprecision::default_ops::
      eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,long_long>
                ((cpp_dec_float<200U,_int,_void> *)this_00,in_stack_fffffffffffffc98,
                 (longlong *)0x6da9a7);
      local_28 = local_1b4;
      local_30 = &local_234;
      local_38 = &local_130;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_39,local_30);
      local_20 = local_1b4;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<200U,_int,_void> *)this_00);
      local_8 = local_1b4;
      local_10 = local_30;
      local_18 = local_38;
      local_48 = (long)*local_38;
      boost::multiprecision::default_ops::
      eval_add<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,long_long>
                ((cpp_dec_float<200U,_int,_void> *)this_00,in_stack_fffffffffffffc98,
                 (longlong *)0x6daa69);
      iVar5 = (int)((ulong)in_stack_fffffffffffffc98 >> 0x20);
      tVar3 = boost::multiprecision::operator<
                        ((int *)in_RDI,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)this_00);
      if (tVar3) {
        minColMem(this_00,iVar5);
      }
    }
    (in_RDI->u).col.used = local_134 + (in_RDI->u).col.used;
    (in_RDI->u).col.max[local_12c] = local_130;
  }
  else {
    if ((in_RDI->u).col.size - (in_RDI->u).col.used < in_EDX) {
      packColumns(in_RDI);
      u = (cpp_dec_float<200U,_int,_void> *)&(in_RDI->u).col.size;
      local_108 = &in_RDI->colMemMult;
      local_110 = &(in_RDI->u).col.used;
      local_100 = &local_350;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_111,local_108);
      local_f8 = &local_350;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffffca0);
      local_e0 = &local_350;
      local_e8 = local_108;
      local_f0 = local_110;
      local_120 = (long)*local_110;
      boost::multiprecision::default_ops::
      eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,long_long>
                ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffffca0,u,(longlong *)0x6dabd8)
      ;
      local_70 = local_2d0;
      local_78 = &local_350;
      local_80 = &local_130;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_81,local_78);
      local_68 = local_2d0;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffffca0);
      local_50 = local_2d0;
      local_58 = local_78;
      local_60 = local_80;
      local_90 = (long)*local_80;
      boost::multiprecision::default_ops::
      eval_add<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,long_long>
                ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffffca0,u,(longlong *)0x6dac97)
      ;
      iVar5 = (int)((ulong)u >> 0x20);
      tVar3 = boost::multiprecision::operator<
                        ((int *)in_RDI,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_fffffffffffffca0);
      if (tVar3) {
        minColMem(in_stack_fffffffffffffca0,iVar5);
      }
    }
    local_23c = (in_RDI->u).col.used;
    local_238 = (in_RDI->u).col.start[local_12c];
    iVar4 = (in_RDI->u).col.len[local_12c] + local_238;
    (in_RDI->u).col.start[local_12c] = local_23c;
    (in_RDI->u).col.used = local_130 + (in_RDI->u).col.used;
    piVar1 = (in_RDI->u).col.max;
    iVar5 = ((in_RDI->u).col.elem[local_12c].prev)->idx;
    piVar1[iVar5] = (in_RDI->u).col.max[local_12c] + piVar1[iVar5];
    (in_RDI->u).col.max[local_12c] = local_130;
    ((in_RDI->u).col.elem[local_12c].next)->prev = (in_RDI->u).col.elem[local_12c].prev;
    ((in_RDI->u).col.elem[local_12c].prev)->next = (in_RDI->u).col.elem[local_12c].next;
    pDVar2 = (in_RDI->u).col.list.prev;
    (in_RDI->u).col.elem[local_12c].next = pDVar2->next;
    ((in_RDI->u).col.elem[local_12c].next)->prev = (in_RDI->u).col.elem + local_12c;
    (in_RDI->u).col.elem[local_12c].prev = pDVar2;
    pDVar2->next = (in_RDI->u).col.elem + local_12c;
    piVar1 = (in_RDI->u).col.idx;
    for (; local_238 < iVar4; local_238 = local_238 + 1) {
      piVar1[local_23c] = piVar1[local_238];
      local_23c = local_23c + 1;
    }
  }
  return;
}

Assistant:

void CLUFactor<R>::remaxCol(int p_col, int len)
{
   assert(u.col.max[p_col] < len);

   if(u.col.elem[p_col].next == &(u.col.list))      /* last in column file */
   {
      int delta = len - u.col.max[p_col];

      if(delta > u.col.size - u.col.used)
      {
         packColumns();
         delta = len - u.col.max[p_col];

         if(u.col.size < colMemMult * u.col.used + len)
            minColMem(2 * u.col.used + len);

         /* minColMem(colMemMult * u.col.used + len); */
      }

      assert(delta <= u.col.size - u.col.used

             && "ERROR: could not allocate memory for column file");

      u.col.used += delta;
      u.col.max[p_col] = len;
   }

   else                        /* column must be moved to end of column file */
   {
      int i, j, k;
      int* idx;
      Dring* ring;

      if(len > u.col.size - u.col.used)
      {
         packColumns();

         if(u.col.size < colMemMult * u.col.used + len)
            minColMem(2 * u.col.used + len);

         /* minColMem(colMemMult * u.col.used + len); */
      }

      assert(len <= u.col.size - u.col.used

             && "ERROR: could not allocate memory for column file");

      j = u.col.used;
      i = u.col.start[p_col];
      k = u.col.len[p_col] + i;
      u.col.start[p_col] = j;
      u.col.used += len;

      u.col.max[u.col.elem[p_col].prev->idx] += u.col.max[p_col];
      u.col.max[p_col] = len;
      removeDR(u.col.elem[p_col]);
      ring = u.col.list.prev;
      init2DR(u.col.elem[p_col], *ring);

      idx = u.col.idx;

      for(; i < k; ++i)
         idx[j++] = idx[i];
   }
}